

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O2

void __thiscall
embree::sse2::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::RecalculatePrimRef<embree::Instance>,_2UL>
::TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,RecalculatePrimRef<embree::Instance> *recalculatePrimRef)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Instance *pIVar3;
  float *pfVar4;
  size_t i;
  float fVar5;
  undefined8 in_XMM0_Qb;
  undefined1 extraout_var [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  float fVar8;
  float fVar9;
  LBBox3fa bn0;
  BBox1f local_e0;
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined1 local_b8 [8];
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_a8 = time_range.upper;
  uStack_b0 = (int)in_XMM0_Qb;
  local_b8 = time_range;
  uStack_ac = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_d8 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar8 = (set->super_PrimInfoMB).max_time_range.upper - local_d8;
  local_c8 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fStack_a4 = local_a8;
  fStack_a0 = local_a8;
  fStack_9c = local_a8;
  fVar5 = roundf((((time_range.lower * 0.5 + local_a8 * 0.5) - local_d8) / fVar8) * local_c8);
  uStack_d4 = extraout_var._0_4_;
  uStack_d0 = extraout_var._4_4_;
  uStack_cc = extraout_var._8_4_;
  fVar5 = (fVar5 / local_c8) * fVar8 + local_d8;
  if (((float)local_b8._0_4_ < fVar5) && (fVar5 < local_a8)) {
    local_48 = (float)local_b8._0_4_;
    uStack_40 = uStack_b0;
    uStack_3c = uStack_ac;
    fStack_54 = (float)local_b8._4_4_;
    uStack_50 = uStack_b0;
    uStack_4c = uStack_ac;
    pfVar4 = &prims[begin].time_range.upper;
    local_d8 = fVar5;
    local_58 = fVar5;
    fStack_44 = fVar5;
    for (; begin < end; begin = begin + 1) {
      fVar8 = *pfVar4 * 0.9999;
      if (((float)local_b8._0_4_ < fVar8) && (((BBox1f *)(pfVar4 + -1))->lower * 1.0001 < fVar5)) {
        local_e0.upper = fStack_44;
        local_e0.lower = local_48;
        pIVar3 = (Instance *)(recalculatePrimRef->scene->geometries).items[(uint)pfVar4[-0xe]].ptr;
        Instance::nonlinearBounds
                  ((LBBox3fa *)&local_98.field_1,pIVar3,&local_e0,
                   &(pIVar3->super_Geometry).time_range,(pIVar3->super_Geometry).fnumTimeSegments);
        aVar7 = this->bounds0[0].bounds0.upper.field_0;
        aVar1 = this->bounds0[0].bounds1.lower.field_0;
        aVar6.m128 = (__m128)minps(this->bounds0[0].bounds0.lower.field_0,local_98.m128);
        aVar2 = this->bounds0[0].bounds1.upper.field_0;
        this->bounds0[0].bounds0.lower.field_0 = aVar6;
        aVar7.m128 = (__m128)maxps(aVar7.m128,local_88);
        this->bounds0[0].bounds0.upper.field_0 = aVar7;
        aVar7.m128 = (__m128)minps(aVar1.m128,local_78);
        this->bounds0[0].bounds1.lower.field_0 = aVar7;
        aVar7.m128 = (__m128)maxps(aVar2.m128,local_68);
        this->bounds0[0].bounds1.upper.field_0 = aVar7;
        fVar9 = (float)(uint)pfVar4[-2];
        fVar5 = (*(BBox1f *)(pfVar4 + -1)).lower;
        fVar8 = (*(BBox1f *)(pfVar4 + -1)).upper - fVar5;
        local_c8 = (local_d8 - fVar5) / fVar8;
        uStack_c4 = uStack_d4;
        uStack_c0 = uStack_d0;
        uStack_bc = uStack_cc;
        fVar8 = floorf((((float)local_b8._0_4_ - fVar5) / fVar8) * 1.0000002 * fVar9);
        fVar5 = 0.0;
        if (0.0 <= fVar8) {
          fVar5 = fVar8;
        }
        fVar8 = ceilf(local_c8 * 0.99999976 * fVar9);
        if (fVar9 <= fVar8) {
          fVar8 = fVar9;
        }
        this->count0[0] = this->count0[0] + (long)((int)fVar8 - (int)fVar5);
        fVar8 = *pfVar4 * 0.9999;
        fVar5 = local_d8;
      }
      if ((fVar5 < fVar8) && (((BBox1f *)(pfVar4 + -1))->lower * 1.0001 < local_a8)) {
        local_e0.upper = fStack_54;
        local_e0.lower = local_58;
        pIVar3 = (Instance *)(recalculatePrimRef->scene->geometries).items[(uint)pfVar4[-0xe]].ptr;
        Instance::nonlinearBounds
                  ((LBBox3fa *)&local_98.field_1,pIVar3,&local_e0,
                   &(pIVar3->super_Geometry).time_range,(pIVar3->super_Geometry).fnumTimeSegments);
        aVar7 = this->bounds1[0].bounds0.upper.field_0;
        aVar1 = this->bounds1[0].bounds1.lower.field_0;
        aVar6.m128 = (__m128)minps(this->bounds1[0].bounds0.lower.field_0,local_98.m128);
        aVar2 = this->bounds1[0].bounds1.upper.field_0;
        this->bounds1[0].bounds0.lower.field_0 = aVar6;
        aVar7.m128 = (__m128)maxps(aVar7.m128,local_88);
        this->bounds1[0].bounds0.upper.field_0 = aVar7;
        aVar7.m128 = (__m128)minps(aVar1.m128,local_78);
        this->bounds1[0].bounds1.lower.field_0 = aVar7;
        aVar7.m128 = (__m128)maxps(aVar2.m128,local_68);
        this->bounds1[0].bounds1.upper.field_0 = aVar7;
        fVar9 = (float)(uint)pfVar4[-2];
        fVar5 = (*(BBox1f *)(pfVar4 + -1)).lower;
        fVar8 = (*(BBox1f *)(pfVar4 + -1)).upper - fVar5;
        local_c8 = (local_a8 - fVar5) / fVar8;
        fVar8 = floorf(((local_d8 - fVar5) / fVar8) * 1.0000002 * fVar9);
        fVar5 = 0.0;
        if (0.0 <= fVar8) {
          fVar5 = fVar8;
        }
        fVar8 = ceilf(local_c8 * 0.99999976 * fVar9);
        if (fVar9 <= fVar8) {
          fVar8 = fVar9;
        }
        this->count1[0] = this->count1[0] + (long)((int)fVar8 - (int)fVar5);
        fVar5 = local_d8;
      }
      pfVar4 = pfVar4 + 0x14;
    }
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }